

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  bool bVar1;
  ulong uVar2;
  cmTarget *this_00;
  char *pcVar3;
  ostream *poVar4;
  string local_218;
  ostringstream local_1f8 [8];
  ostringstream e;
  cmTarget *target_1;
  cmTarget *local_58;
  cmTarget *target;
  allocator local_39;
  string local_38;
  cmGetPropertyCommand *local_18;
  cmGetPropertyCommand *this_local;
  
  local_18 = this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==(&this->PropertyName,"ALIASED_TARGET");
    if (bVar1) {
      bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,&this->Name);
      if (bVar1) {
        local_58 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,&this->Name,false);
        if (local_58 != (cmTarget *)0x0) {
          cmTarget::GetName_abi_cxx11_(local_58);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          this_local._7_1_ = StoreResult(this,pcVar3);
          goto LAB_0050b5dd;
        }
        local_58 = (cmTarget *)0x0;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target_1,
                     &this->Variable,"-NOTFOUND");
      pcVar3 = (char *)std::__cxx11::string::c_str();
      this_local._7_1_ = StoreResult(this,pcVar3);
      std::__cxx11::string::~string((string *)&target_1);
    }
    else {
      this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,&this->Name,false);
      if (this_00 == (cmTarget *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        poVar4 = std::operator<<((ostream *)local_1f8,"could not find TARGET ");
        poVar4 = std::operator<<(poVar4,(string *)&this->Name);
        std::operator<<(poVar4,".  Perhaps it has not yet been created.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
      }
      else {
        pcVar3 = cmTarget::GetProperty(this_00,&this->PropertyName,(this->super_cmCommand).Makefile)
        ;
        this_local._7_1_ = StoreResult(this,pcVar3);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"not given name for TARGET scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    this_local._7_1_ = 0;
  }
LAB_0050b5dd:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if(this->Name.empty())
    {
    this->SetError("not given name for TARGET scope.");
    return false;
    }

  if(this->PropertyName == "ALIASED_TARGET")
    {
    if(this->Makefile->IsAlias(this->Name))
      {
      if(cmTarget* target =
                          this->Makefile->FindTargetToUse(this->Name))
        {
        return this->StoreResult(target->GetName().c_str());
        }
      }
    return this->StoreResult((this->Variable + "-NOTFOUND").c_str());
    }
  if(cmTarget* target = this->Makefile->FindTargetToUse(this->Name))
    {
    return this->StoreResult(target->GetProperty(this->PropertyName,
                                                 this->Makefile));
    }
  else
    {
    std::ostringstream e;
    e << "could not find TARGET " << this->Name
      << ".  Perhaps it has not yet been created.";
    this->SetError(e.str());
    return false;
    }
}